

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_semaphore_wrapper.hpp
# Opt level: O1

bool __thiscall
oqpi::posix_semaphore_wrapper::waitFor<long,std::ratio<1l,1000000l>>
          (posix_semaphore_wrapper *this,duration<long,_std::ratio<1L,_1000000L>_> *relTime)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  timespec t;
  timespec local_20;
  
  iVar2 = clock_gettime(0,&local_20);
  if (iVar2 == -1) {
    waitFor<long,std::ratio<1l,1000000l>>();
    bVar4 = false;
  }
  else {
    lVar1 = relTime->__r / 1000000;
    local_20.tv_sec = local_20.tv_sec + lVar1;
    local_20.tv_nsec = local_20.tv_nsec + lVar1 * -1000000000 + relTime->__r * 1000;
    iVar2 = sem_timedwait((sem_t *)this->handle_,&local_20);
    if (iVar2 == -1) {
      piVar3 = __errno_location();
      if (*piVar3 != 0x6e) {
        fprintf(_stderr,"[error  ] sem_timedwait failed with error code %d\n");
      }
    }
    bVar4 = iVar2 == 0;
  }
  return bVar4;
}

Assistant:

bool waitFor(const std::chrono::duration<_Rep, _Period> &relTime)
        {
            timespec t;
            if (clock_gettime(CLOCK_REALTIME, &t) == -1)
            {
                oqpi_error("clock_gettime failed with error code %d", errno);
                return false;
            }

            auto nanoseconds    = std::chrono::duration_cast<std::chrono::nanoseconds>(relTime);
            const auto secs     = std::chrono::duration_cast<std::chrono::seconds>(nanoseconds);
            nanoseconds         -= secs;
            t.tv_sec            += secs.count();
            t.tv_nsec           += nanoseconds.count();

            const auto error    = sem_timedwait(handle_, &t);
            if(error == -1 && errno != ETIMEDOUT)
            {
                oqpi_error("sem_timedwait failed with error code %d", errno);
            }
            return error == 0;
        }